

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O0

void __thiscall
myvk::SemaphoreStageGroup::SemaphoreStageGroup
          (SemaphoreStageGroup *this,
          initializer_list<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>
          *stage_semaphores)

{
  initializer_list<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_> __l;
  undefined8 *in_RSI;
  long in_RDI;
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  *this_00;
  allocator_type *in_stack_ffffffffffffffb8;
  SemaphoreStageGroup *in_stack_ffffffffffffffc0;
  iterator ppVar1;
  size_type sVar2;
  
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::vector
            ((vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_> *)0x2cba25);
  this_00 = (vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
             *)(in_RDI + 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2cba38);
  ppVar1 = (iterator)*in_RSI;
  sVar2 = in_RSI[1];
  std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>::allocator
            ((allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_> *)0x2cba54);
  __l._M_len = sVar2;
  __l._M_array = ppVar1;
  std::
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffffc0,__l,in_stack_ffffffffffffffb8);
  Initialize(in_stack_ffffffffffffffc0,
             (vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
              *)in_stack_ffffffffffffffb8);
  std::
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  ::~vector(this_00);
  std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>::~allocator
            ((allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_> *)
             &stack0xffffffffffffffc7);
  return;
}

Assistant:

SemaphoreStageGroup::SemaphoreStageGroup(
    const std::initializer_list<std::pair<Ptr<Semaphore>, VkPipelineStageFlags>> &stage_semaphores) {
	Initialize(stage_semaphores);
}